

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O3

int lreadline(lua_State *L)

{
  uint skip;
  int iVar1;
  int iVar2;
  int iVar3;
  socket_buffer *psVar4;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  buffer_node *pbVar11;
  long lVar12;
  buffer_node *pbVar13;
  char *__s2;
  int iVar14;
  uint uVar15;
  size_t seplen;
  size_t local_40;
  socket_buffer *local_38;
  ulong uVar10;
  
  psVar4 = (socket_buffer *)lua_touserdata(L,1);
  if (psVar4 == (socket_buffer *)0x0) {
    luaL_error(L,"Need buffer object at param 1");
  }
  iVar1 = lua_type(L,2);
  local_40 = 0;
  pcVar5 = luaL_checklstring(L,3,&local_40);
  pbVar13 = psVar4->head;
  if (pbVar13 != (buffer_node *)0x0) {
    skip = (uint)local_40;
    uVar6 = local_40 & 0xffffffff;
    iVar7 = psVar4->size - (uint)local_40;
    if ((int)(uint)local_40 <= psVar4->size) {
      iVar8 = psVar4->offset;
      iVar2 = pbVar13->sz - iVar8;
      iVar14 = 0;
      local_38 = psVar4;
      do {
        uVar15 = pbVar13->sz - iVar8;
        pbVar11 = pbVar13;
        __s2 = pcVar5;
        uVar9 = skip;
        iVar3 = iVar8;
        if ((int)uVar15 < (int)skip) {
          lVar12 = (long)iVar8;
          uVar10 = uVar6;
          do {
            if ((0 < (int)uVar15) &&
               (iVar3 = bcmp(pbVar11->msg + lVar12,__s2,(ulong)uVar15), iVar3 != 0))
            goto LAB_00120c36;
            pbVar11 = pbVar11->next;
            __s2 = __s2 + (int)uVar15;
            uVar9 = (int)uVar10 - uVar15;
            uVar10 = (ulong)uVar9;
            uVar15 = pbVar11->sz;
            lVar12 = 0;
            iVar3 = 0;
          } while ((int)uVar15 < (int)uVar9);
        }
        iVar3 = bcmp(pbVar11->msg + iVar3,__s2,(long)(int)uVar9);
        psVar4 = local_38;
        if (iVar3 == 0) {
          if (iVar1 == 5) {
            pop_lstring(L,local_38,iVar14 + skip,skip);
            psVar4->size = psVar4->size - (iVar14 + (uint)local_40);
            return 1;
          }
          lua_pushboolean(L,1);
          return 1;
        }
LAB_00120c36:
        iVar2 = iVar2 + -1;
        if (iVar2 == 0) {
          pbVar13 = pbVar13->next;
          if (pbVar13 == (buffer_node *)0x0) {
            return 0;
          }
          iVar2 = pbVar13->sz;
          iVar8 = 0;
        }
        else {
          iVar8 = iVar8 + 1;
        }
        iVar14 = iVar14 + 1;
      } while (iVar14 != iVar7 + 1);
    }
  }
  return 0;
}

Assistant:

static int
lreadline(lua_State *L) {
	struct socket_buffer * sb = lua_touserdata(L, 1);
	if (sb == NULL) {
		return luaL_error(L, "Need buffer object at param 1");
	}
	// only check
	bool check = !lua_istable(L, 2);
	size_t seplen = 0;
	const char *sep = luaL_checklstring(L,3,&seplen);
	int i;
	struct buffer_node *current = sb->head;
	if (current == NULL)
		return 0;
	int from = sb->offset;
	int bytes = current->sz - from;
	for (i=0;i<=sb->size - (int)seplen;i++) {
		if (check_sep(current, from, sep, seplen)) {
			if (check) {
				lua_pushboolean(L,true);
			} else {
				pop_lstring(L, sb, i+seplen, seplen);
				sb->size -= i+seplen;
			}
			return 1;
		}
		++from;
		--bytes;
		if (bytes == 0) {
			current = current->next;
			from = 0;
			if (current == NULL)
				break;
			bytes = current->sz;
		}
	}
	return 0;
}